

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Count.cc
# Opt level: O3

void __thiscall Pl_Count::Pl_Count(Pl_Count *this,char *identifier,Pipeline *next)

{
  Members *pMVar1;
  logic_error *this_00;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Count_002eb3d8;
  pMVar1 = (Members *)operator_new(0x10);
  pMVar1->count = 0;
  *(undefined8 *)&pMVar1->last_char = 0;
  (this->m)._M_t.super___uniq_ptr_impl<Pl_Count::Members,_std::default_delete<Pl_Count::Members>_>.
  _M_t.super__Tuple_impl<0UL,_Pl_Count::Members_*,_std::default_delete<Pl_Count::Members>_>.
  super__Head_base<0UL,_Pl_Count::Members_*,_false>._M_head_impl = pMVar1;
  if (next != (Pipeline *)0x0) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Attempt to create Pl_Count with nullptr as next");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Pl_Count::Pl_Count(char const* identifier, Pipeline* next) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>())
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_Count with nullptr as next");
    }
}